

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O3

void __thiscall DataServer::readFileAndOutput(DataServer *this)

{
  undefined8 *puVar1;
  uint uVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  string blockpath;
  string __str_1;
  string __str;
  ifstream blcokFile;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8 [2];
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  
  uVar2 = this->serverId;
  uVar13 = -uVar2;
  if (0 < (int)uVar2) {
    uVar13 = uVar2;
  }
  uVar12 = 1;
  if (9 < uVar13) {
    uVar11 = (ulong)uVar13;
    uVar8 = 4;
    do {
      uVar12 = uVar8;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_0011a2c1;
      }
      if (uVar7 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_0011a2c1;
      }
      if (uVar7 < 10000) goto LAB_0011a2c1;
      uVar11 = uVar11 / 10000;
      uVar8 = uVar12 + 4;
    } while (99999 < uVar7);
    uVar12 = uVar12 + 1;
  }
LAB_0011a2c1:
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct((ulong)local_278,(char)uVar12 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_278[0] + (uVar2 >> 0x1f),uVar12,uVar13);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0x13334a);
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_248 = *plVar9;
    lStack_240 = plVar4[3];
    local_258 = &local_248;
  }
  else {
    local_248 = *plVar9;
    local_258 = (long *)*plVar4;
  }
  local_250 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_2b8 = &local_2a8;
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_2a8 = *plVar9;
    lStack_2a0 = plVar4[3];
  }
  else {
    local_2a8 = *plVar9;
    local_2b8 = (long *)*plVar4;
  }
  local_2b0 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2b8,(ulong)read_logic_file_abi_cxx11_._M_dataplus._M_p)
  ;
  local_298 = &local_288;
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_288 = *plVar9;
    lStack_280 = plVar4[3];
  }
  else {
    local_288 = *plVar9;
    local_298 = (long *)*plVar4;
  }
  local_290 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_298);
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_228 = *puVar10;
    lStack_220 = plVar4[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar10;
    local_238 = (ulong *)*plVar4;
  }
  local_230 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar2 = -read_block;
  if (0 < read_block) {
    uVar2 = read_block;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar11 = (ulong)uVar2;
    uVar12 = 4;
    do {
      uVar13 = uVar12;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0011a4db;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0011a4db;
      }
      if (uVar8 < 10000) goto LAB_0011a4db;
      uVar11 = uVar11 / 10000;
      uVar12 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_0011a4db:
  uVar12 = (uint)read_block >> 0x1f;
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct((ulong)&local_2d8,(char)uVar13 - (char)(read_block >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar12 + (long)local_2d8),uVar13,uVar2);
  uVar11 = 0xf;
  if (local_238 != &local_228) {
    uVar11 = local_228;
  }
  if (uVar11 < (ulong)(local_2d0 + local_230)) {
    uVar11 = 0xf;
    if (local_2d8 != local_2c8) {
      uVar11 = local_2c8[0];
    }
    if ((ulong)(local_2d0 + local_230) <= uVar11) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_238);
      goto LAB_0011a572;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_2d8);
LAB_0011a572:
  local_2f8 = &local_2e8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_2e8 = *puVar1;
    uStack_2e0 = puVar5[3];
  }
  else {
    local_2e8 = *puVar1;
    local_2f8 = (undefined8 *)*puVar5;
  }
  local_2f0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0]);
  }
  std::ifstream::ifstream(&local_238,(string *)&local_2f8,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open block",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else {
    pvVar6 = operator_new__(0x200000);
    std::istream::seekg((long)&local_238,offset_in_block);
    std::istream::read((char *)&local_238,(long)pvVar6);
    std::ostream::write((char *)&std::cout,(long)pvVar6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    operator_delete__(pvVar6);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&local_238);
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  return;
}

Assistant:

void readFileAndOutput() const
    {
        string blockpath = "dfsfiles/datanode" + to_string(serverId) + "/"
        + read_logic_file + "-part" + to_string(read_block);

        ifstream blcokFile(blockpath);

        if (blcokFile.is_open())
        {
            char *buffer = new char[block_size_int];
            blcokFile.seekg(offset_in_block, blcokFile.beg);
            blcokFile.read(buffer, read_count);

            cout.write(buffer, read_count);
            cout << endl;

            delete[] buffer;
            blcokFile.close();
        }
        else
        {
            cerr << "Failed to open block" << endl;
        }
    }